

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::SELU_x86_fma::forward_inplace(SELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  undefined1 auVar4 [32];
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  undefined1 (*pauVar10) [32];
  long lVar11;
  undefined1 auVar13 [16];
  float fVar12;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar22 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 extraout_var [60];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar11 = 0;
    auVar44 = ZEXT3264(CONCAT428(0x3f000000,
                                 CONCAT424(0x3f000000,
                                           CONCAT420(0x3f000000,
                                                     CONCAT416(0x3f000000,
                                                               CONCAT412(0x3f000000,
                                                                         CONCAT48(0x3f000000,
                                                                                  0x3f0000003f000000
                                                                                 )))))));
    auVar47 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar48._8_4_ = 0x3e2aaaaa;
      auVar48._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar46._8_4_ = 0x3d2aa9c1;
      auVar46._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar43._8_4_ = 0x3c088908;
      auVar43._0_8_ = 0x3c0889083c088908;
      auVar41._8_4_ = 0x39506967;
      auVar41._0_8_ = 0x3950696739506967;
      auVar48._12_4_ = 0x3e2aaaaa;
      auVar46._12_4_ = 0x3d2aa9c1;
      auVar43._12_4_ = 0x3c088908;
      auVar41._12_4_ = 0x39506967;
      auVar48._16_4_ = 0x3e2aaaaa;
      auVar46._16_4_ = 0x3d2aa9c1;
      auVar43._16_4_ = 0x3c088908;
      auVar41._16_4_ = 0x39506967;
      auVar48._20_4_ = 0x3e2aaaaa;
      auVar46._20_4_ = 0x3d2aa9c1;
      auVar43._20_4_ = 0x3c088908;
      auVar41._20_4_ = 0x39506967;
      auVar48._24_4_ = 0x3e2aaaaa;
      auVar46._24_4_ = 0x3d2aa9c1;
      auVar43._24_4_ = 0x3c088908;
      auVar41._24_4_ = 0x39506967;
      auVar48._28_4_ = 0x3e2aaaaa;
      auVar46._28_4_ = 0x3d2aa9c1;
      auVar43._28_4_ = 0x3c088908;
      auVar41._28_4_ = 0x39506967;
      pauVar10 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar9 < 8) {
        uVar7 = 0;
      }
      else {
        fVar1 = (this->super_SELU).alpha;
        auVar14._4_4_ = fVar1;
        auVar14._0_4_ = fVar1;
        auVar14._8_4_ = fVar1;
        auVar14._12_4_ = fVar1;
        auVar14._16_4_ = fVar1;
        auVar14._20_4_ = fVar1;
        auVar14._24_4_ = fVar1;
        auVar14._28_4_ = fVar1;
        fVar1 = (this->super_SELU).lambda;
        iVar5 = 7;
        auVar24._8_4_ = 0x3f800000;
        auVar24._0_8_ = 0x3f8000003f800000;
        auVar24._12_4_ = 0x3f800000;
        do {
          auVar21 = vminps_avx(*pauVar10,ZEXT1632(ZEXT816(0) << 0x40));
          auVar25._8_4_ = 0x42b0c0a5;
          auVar25._0_8_ = 0x42b0c0a542b0c0a5;
          auVar25._12_4_ = 0x42b0c0a5;
          auVar25._16_4_ = 0x42b0c0a5;
          auVar25._20_4_ = 0x42b0c0a5;
          auVar25._24_4_ = 0x42b0c0a5;
          auVar25._28_4_ = 0x42b0c0a5;
          auVar21 = vminps_avx(auVar21,auVar25);
          auVar26._8_4_ = 0xc2b0c0a5;
          auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar26._12_4_ = 0xc2b0c0a5;
          auVar26._16_4_ = 0xc2b0c0a5;
          auVar26._20_4_ = 0xc2b0c0a5;
          auVar26._24_4_ = 0xc2b0c0a5;
          auVar26._28_4_ = 0xc2b0c0a5;
          auVar4 = vmaxps_avx(auVar21,auVar26);
          auVar27._8_4_ = 0x3fb8aa3b;
          auVar27._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar27._12_4_ = 0x3fb8aa3b;
          auVar27._16_4_ = 0x3fb8aa3b;
          auVar27._20_4_ = 0x3fb8aa3b;
          auVar27._24_4_ = 0x3fb8aa3b;
          auVar27._28_4_ = 0x3fb8aa3b;
          auVar17 = vfmadd213ps_fma(auVar27,auVar4,auVar44._0_32_);
          auVar19 = vroundps_avx(ZEXT1632(auVar17),1);
          auVar21 = vcmpps_avx(ZEXT1632(auVar17),auVar19,1);
          auVar21 = vandps_avx(auVar47._0_32_,auVar21);
          auVar21 = vsubps_avx(auVar19,auVar21);
          auVar33._8_4_ = 0x3f318000;
          auVar33._0_8_ = 0x3f3180003f318000;
          auVar33._12_4_ = 0x3f318000;
          auVar33._16_4_ = 0x3f318000;
          auVar33._20_4_ = 0x3f318000;
          auVar33._24_4_ = 0x3f318000;
          auVar33._28_4_ = 0x3f318000;
          auVar17 = vfmsub231ps_fma(auVar4,auVar21,auVar33);
          auVar34._8_4_ = 0x395e8083;
          auVar34._0_8_ = 0x395e8083395e8083;
          auVar34._12_4_ = 0x395e8083;
          auVar34._16_4_ = 0x395e8083;
          auVar34._20_4_ = 0x395e8083;
          auVar34._24_4_ = 0x395e8083;
          auVar34._28_4_ = 0x395e8083;
          auVar22 = vfmsub231ps_fma(ZEXT1632(auVar17),auVar21,auVar34);
          auVar19 = ZEXT1632(auVar22);
          auVar4._28_4_ = 0x395e8083;
          auVar4._0_28_ =
               ZEXT1628(CONCAT412(auVar22._12_4_ * auVar22._12_4_,
                                  CONCAT48(auVar22._8_4_ * auVar22._8_4_,
                                           CONCAT44(auVar22._4_4_ * auVar22._4_4_,
                                                    auVar22._0_4_ * auVar22._0_4_))));
          auVar51._8_4_ = 0x3ab743ce;
          auVar51._0_8_ = 0x3ab743ce3ab743ce;
          auVar51._12_4_ = 0x3ab743ce;
          auVar51._16_4_ = 0x3ab743ce;
          auVar51._20_4_ = 0x3ab743ce;
          auVar51._24_4_ = 0x3ab743ce;
          auVar51._28_4_ = 0x3ab743ce;
          auVar17 = vfmadd213ps_fma(auVar41,auVar19,auVar51);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar43);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar46);
          auVar19 = ZEXT1632(auVar22);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar48);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar44._0_32_);
          auVar40 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar4,auVar19);
          auVar17._0_4_ = (int)auVar21._0_4_;
          auVar17._4_4_ = (int)auVar21._4_4_;
          auVar17._8_4_ = (int)auVar21._8_4_;
          auVar17._12_4_ = (int)auVar21._12_4_;
          auVar20._16_4_ = (int)auVar21._16_4_;
          auVar20._0_16_ = auVar17;
          auVar20._20_4_ = (int)auVar21._20_4_;
          auVar20._24_4_ = (int)auVar21._24_4_;
          auVar20._28_4_ = (int)auVar21._28_4_;
          auVar22 = vpslld_avx(auVar17,0x17);
          auVar17 = vpslld_avx(auVar20._16_16_,0x17);
          auVar17 = vpaddd_avx(auVar24,auVar17);
          auVar22 = vpaddd_avx(auVar24,auVar22);
          auVar21._16_16_ = auVar17;
          auVar21._0_16_ = auVar22;
          auVar28._0_4_ = auVar47._0_4_ + auVar40._0_4_;
          auVar28._4_4_ = auVar47._4_4_ + auVar40._4_4_;
          auVar28._8_4_ = auVar47._8_4_ + auVar40._8_4_;
          auVar28._12_4_ = auVar47._12_4_ + auVar40._12_4_;
          auVar28._16_4_ = auVar47._16_4_ + 0.0;
          auVar28._20_4_ = auVar47._20_4_ + 0.0;
          auVar28._24_4_ = auVar47._24_4_ + 0.0;
          auVar28._28_4_ = auVar47._28_4_ + 0.0;
          auVar17 = vfmsub213ps_fma(auVar21,auVar28,auVar47._0_32_);
          auVar21 = vmaxps_avx(*pauVar10,ZEXT1632(ZEXT816(0) << 0x40));
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar14,auVar21);
          auVar19._4_4_ = auVar17._4_4_ * fVar1;
          auVar19._0_4_ = auVar17._0_4_ * fVar1;
          auVar19._8_4_ = auVar17._8_4_ * fVar1;
          auVar19._12_4_ = auVar17._12_4_ * fVar1;
          auVar19._16_4_ = fVar1 * 0.0;
          auVar19._20_4_ = fVar1 * 0.0;
          auVar19._24_4_ = fVar1 * 0.0;
          auVar19._28_4_ = auVar21._28_4_;
          *pauVar10 = auVar19;
          pauVar10 = pauVar10 + 1;
          iVar5 = iVar5 + 8;
        } while (iVar5 < (int)uVar9);
        auVar49 = ZEXT864(0) << 0x20;
        uVar7 = uVar9 & 0xfffffff8;
      }
      auVar40._8_4_ = 0x3f800000;
      auVar40._0_8_ = 0x3f8000003f800000;
      auVar40._12_4_ = 0x3f800000;
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar45._8_4_ = 0xc2b0c0a5;
      auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar45._12_4_ = 0xc2b0c0a5;
      auVar50._8_4_ = 0x3fb8aa3b;
      auVar50._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar50._12_4_ = 0x3fb8aa3b;
      if ((int)(uVar7 | 3) < (int)uVar9) {
        fVar1 = (this->super_SELU).alpha;
        auVar13._4_4_ = fVar1;
        auVar13._0_4_ = fVar1;
        auVar13._8_4_ = fVar1;
        auVar13._12_4_ = fVar1;
        fVar1 = (this->super_SELU).lambda;
        auVar42._8_4_ = 0x3f000000;
        auVar42._0_8_ = 0x3f0000003f000000;
        auVar42._12_4_ = 0x3f000000;
        uVar6 = uVar7;
        do {
          auVar24 = vminps_avx(auVar49._0_16_,*(undefined1 (*) [16])*pauVar10);
          auVar24 = vminps_avx(auVar24,auVar22);
          auVar16 = vmaxps_avx(auVar45,auVar24);
          auVar24 = vfmadd213ps_fma(auVar50,auVar16,auVar42);
          auVar29._0_4_ = (int)auVar24._0_4_;
          auVar29._4_4_ = (int)auVar24._4_4_;
          auVar29._8_4_ = (int)auVar24._8_4_;
          auVar29._12_4_ = (int)auVar24._12_4_;
          auVar17 = vcvtdq2ps_avx(auVar29);
          auVar24 = vcmpps_avx(auVar24,auVar17,1);
          auVar24 = vandps_avx(auVar40,auVar24);
          auVar24 = vsubps_avx(auVar17,auVar24);
          auVar30._8_4_ = 0x3f318000;
          auVar30._0_8_ = 0x3f3180003f318000;
          auVar30._12_4_ = 0x3f318000;
          auVar17 = vfmsub231ps_fma(auVar16,auVar24,auVar30);
          auVar31._8_4_ = 0x395e8083;
          auVar31._0_8_ = 0x395e8083395e8083;
          auVar31._12_4_ = 0x395e8083;
          auVar16 = vfmsub231ps_fma(auVar17,auVar24,auVar31);
          auVar32._0_4_ = auVar16._0_4_ * auVar16._0_4_;
          auVar32._4_4_ = auVar16._4_4_ * auVar16._4_4_;
          auVar32._8_4_ = auVar16._8_4_ * auVar16._8_4_;
          auVar32._12_4_ = auVar16._12_4_ * auVar16._12_4_;
          auVar35._8_4_ = 0x39506967;
          auVar35._0_8_ = 0x3950696739506967;
          auVar35._12_4_ = 0x39506967;
          auVar36._8_4_ = 0x3ab743ce;
          auVar36._0_8_ = 0x3ab743ce3ab743ce;
          auVar36._12_4_ = 0x3ab743ce;
          auVar17 = vfmadd213ps_fma(auVar35,auVar16,auVar36);
          auVar37._8_4_ = 0x3c088908;
          auVar37._0_8_ = 0x3c0889083c088908;
          auVar37._12_4_ = 0x3c088908;
          auVar17 = vfmadd213ps_fma(auVar17,auVar16,auVar37);
          auVar38._8_4_ = 0x3d2aa9c1;
          auVar38._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar38._12_4_ = 0x3d2aa9c1;
          auVar17 = vfmadd213ps_fma(auVar17,auVar16,auVar38);
          auVar39._8_4_ = 0x3e2aaaaa;
          auVar39._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar39._12_4_ = 0x3e2aaaaa;
          auVar17 = vfmadd213ps_fma(auVar17,auVar16,auVar39);
          auVar17 = vfmadd213ps_fma(auVar17,auVar16,auVar42);
          auVar17 = vfmadd213ps_fma(auVar17,auVar32,auVar16);
          auVar18._0_4_ = auVar17._0_4_ + 1.0;
          auVar18._4_4_ = auVar17._4_4_ + 1.0;
          auVar18._8_4_ = auVar17._8_4_ + 1.0;
          auVar18._12_4_ = auVar17._12_4_ + 1.0;
          auVar23._0_4_ = (int)auVar24._0_4_;
          auVar23._4_4_ = (int)auVar24._4_4_;
          auVar23._8_4_ = (int)auVar24._8_4_;
          auVar23._12_4_ = (int)auVar24._12_4_;
          auVar24 = vpslld_avx(auVar23,0x17);
          auVar24 = vpaddd_avx(auVar40,auVar24);
          auVar17 = vfmsub213ps_fma(auVar24,auVar18,auVar40);
          auVar24 = vmaxps_avx(auVar49._0_16_,*(undefined1 (*) [16])*pauVar10);
          auVar24 = vfmadd213ps_fma(auVar17,auVar13,auVar24);
          auVar16._0_4_ = auVar24._0_4_ * fVar1;
          auVar16._4_4_ = auVar24._4_4_ * fVar1;
          auVar16._8_4_ = auVar24._8_4_ * fVar1;
          auVar16._12_4_ = auVar24._12_4_ * fVar1;
          *(undefined1 (*) [16])*pauVar10 = auVar16;
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
          uVar7 = uVar6 + 4;
          iVar5 = uVar6 + 7;
          uVar6 = uVar7;
        } while (iVar5 < (int)uVar9);
      }
      if (uVar9 - uVar7 != 0 && (int)uVar7 <= (int)uVar9) {
        fVar1 = (this->super_SELU).lambda;
        fVar2 = (this->super_SELU).alpha;
        lVar8 = 0;
        do {
          fVar12 = *(float *)(*pauVar10 + lVar8 * 4);
          if (0.0 <= fVar12) {
            fVar12 = fVar12 * (this->super_SELU).lambda;
          }
          else {
            auVar15._0_4_ = expf(fVar12);
            auVar15._4_60_ = extraout_var;
            auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar47 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            auVar44 = ZEXT3264(CONCAT428(0x3f000000,
                                         CONCAT424(0x3f000000,
                                                   CONCAT420(0x3f000000,
                                                             CONCAT416(0x3f000000,
                                                                       CONCAT412(0x3f000000,
                                                                                 CONCAT48(0x3f000000
                                                                                          ,
                                                  0x3f0000003f000000)))))));
            auVar24 = ZEXT416((uint)(fVar1 * fVar2));
            auVar24 = vfmsub213ss_fma(auVar15._0_16_,auVar24,auVar24);
            fVar12 = auVar24._0_4_;
          }
          *(float *)(*pauVar10 + lVar8 * 4) = fVar12;
          lVar8 = lVar8 + 1;
        } while (uVar9 - uVar7 != (int)lVar8);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar3);
  }
  return 0;
}

Assistant:

int SELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}